

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

chunk_conflict * mtn_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  short sVar1;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int A;
  int A_00;
  int y_00;
  int x_00;
  feature *pfVar8;
  loc lVar9;
  loc lVar10;
  loc grid2;
  wchar_t y;
  wchar_t x;
  wchar_t b;
  wchar_t a;
  chunk_conflict *c;
  wchar_t local_188;
  wchar_t wStack_184;
  _Bool amon_rudh;
  wchar_t form_feats [7];
  loc stairs [3];
  loc nearest_point;
  loc pathpoints [20];
  wchar_t randpoints [20];
  wchar_t floors;
  wchar_t dist;
  wchar_t min;
  wchar_t form_grids;
  wchar_t last_place;
  wchar_t place;
  wchar_t plats;
  wchar_t j;
  wchar_t i;
  loc grid;
  char **p_error_local;
  wchar_t width_local;
  wchar_t height_local;
  player *p_local;
  
  wVar4 = (wchar_t)p->place;
  sVar1 = p->last_place;
  dist = L'\0';
  randpoints[0x13] = L'\0';
  stairs[2].y = width / 2;
  stairs[2].x = height / 2;
  local_188 = FEAT_PASS_RUBBLE;
  wStack_184 = FEAT_RUBBLE;
  form_feats[0] = FEAT_GRASS;
  form_feats[1] = FEAT_TREE;
  form_feats[2] = FEAT_TREE2;
  form_feats[3] = FEAT_ROAD;
  form_feats[4] = FEAT_NONE;
  bVar2 = false;
  p_local = (player *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  *(int *)((long)&p_local->class + 4) = (int)p->depth;
  (p_local->grid).x = wVar4;
  for (i = L'\0'; i < *(wchar_t *)&p_local->ht; i = i + L'\x01') {
    _j = (loc_conflict)((ulong)(uint)i << 0x20);
    while( true ) {
      if (p_local->au <= j) break;
      square_set_feat((chunk *)p_local,_j,FEAT_GRASS);
      j = j + L'\x01';
    }
  }
  set_num_vaults((chunk_conflict *)p_local);
  make_edges((chunk_conflict *)p_local,false,false);
  alloc_paths((chunk_conflict *)p_local,p,wVar4,(int)sVar1);
  wVar5 = L'\0';
  while (wVar5 < *(wchar_t *)&p_local->ht) {
    _j = (loc_conflict)((ulong)(uint)wVar5 << 0x20);
    while( true ) {
      if (p_local->au <= j) break;
      pfVar8 = square_feat((chunk *)p_local,_j);
      if (pfVar8->fidx == FEAT_GRASS) {
        square_set_feat((chunk *)p_local,_j,FEAT_GRANITE);
      }
      j = j + L'\x01';
    }
    wVar5 = i + L'\x01';
  }
  if (world->levels[wVar4].down != (char *)0x0) {
    bVar2 = true;
    plats = L'\x03';
    while (plats != L'\0') {
      uVar6 = Rand_div(*(wchar_t *)&p_local->ht + L'\xfffffffe');
      uVar7 = Rand_div(p_local->au + L'\xfffffffe');
      i = uVar6 + L'\x01';
      j = uVar7 + L'\x01';
      pfVar8 = square_feat((chunk *)p_local,_j);
      if ((pfVar8->fidx == FEAT_ROAD) ||
         (pfVar8 = square_feat((chunk *)p_local,_j), pfVar8->fidx == FEAT_GRASS)) {
        square_set_feat((chunk *)p_local,_j,FEAT_MORE);
        square_mark((chunk *)p_local,_j);
        plats = plats + L'\xffffffff';
        *(loc_conflict *)(form_feats + (long)(2 - plats) * 2 + 6) = _j;
        if ((plats == L'\0') && (wVar4 = level_topography((int)sVar1), wVar4 == L'\a')) {
          player_place((chunk_conflict1 *)p_local,p,(loc)_j);
        }
      }
    }
  }
  wVar4 = L'\0';
  while (wVar4 < *(wchar_t *)&p_local->ht) {
    _j = (loc_conflict)((ulong)(uint)wVar4 << 0x20);
    while( true ) {
      if (p_local->au <= j) break;
      pfVar8 = square_feat((chunk *)p_local,_j);
      if (pfVar8->fidx == FEAT_ROAD) {
        square_mark((chunk *)p_local,_j);
        randpoints[0x13] = randpoints[0x13] + L'\x01';
      }
      j = j + L'\x01';
    }
    wVar4 = i + L'\x01';
  }
  for (place = L'\0'; place < L'\x14'; place = place + L'\x01') {
    wVar4 = Rand_div(randpoints[0x13]);
    randpoints[(long)place + -2] = wVar4;
  }
  wVar4 = L'\0';
  while (wVar4 < *(wchar_t *)&p_local->ht) {
    _j = (loc_conflict)((ulong)(uint)wVar4 << 0x20);
    while( true ) {
      if (p_local->au <= j) break;
      pfVar8 = square_feat((chunk *)p_local,_j);
      if (pfVar8->fidx == FEAT_ROAD) {
        randpoints[0x13] = randpoints[0x13] + L'\xffffffff';
        for (place = L'\0'; place < L'\x14'; place = place + L'\x01') {
          if (randpoints[0x13] == randpoints[(long)place + -2]) {
            *(loc_conflict *)(pathpoints + (long)place + -1) = _j;
          }
        }
      }
      j = j + L'\x01';
    }
    wVar4 = i + L'\x01';
  }
  if (bVar2) {
    for (place = L'\0'; place < L'\x03'; place = place + L'\x01') {
      lVar9 = *(loc *)(form_feats + (long)place * 2 + 6);
      floors = p_local->au + *(wchar_t *)&p_local->ht;
      for (plats = L'\0'; plats < L'\x14'; plats = plats + L'\x01') {
        wVar4 = distance(lVar9,pathpoints[(long)plats + -1]);
        if (wVar4 < floors) {
          stairs[2] = pathpoints[(long)plats + -1];
          floors = wVar4;
        }
      }
      mtn_connect((chunk_conflict *)p_local,lVar9,stairs[2]);
    }
  }
  last_place = rand_range(2,4);
  for (place = L'\0'; place < L'2'; place = place + L'\x01') {
    uVar6 = Rand_div(6);
    A = uVar6 + 4;
    uVar6 = Rand_div(5);
    A_00 = uVar6 + 4;
    y_00 = rand_range(A_00,(*(wchar_t *)&p_local->ht + L'\xffffffff') - A_00);
    x_00 = rand_range(A,(p_local->au + L'\xffffffff') - A);
    lVar9 = loc(x_00,y_00);
    lVar10 = loc(-A,-A_00);
    lVar9 = loc_sum(lVar9,lVar10);
    lVar10 = loc(x_00,y_00);
    grid2 = loc(A,A_00);
    lVar10 = loc_sum(lVar10,grid2);
    _Var3 = check_clearing_space((chunk_conflict *)p_local,lVar9,lVar10);
    if ((_Var3) &&
       (_Var3 = generate_starburst_room
                          ((chunk_conflict *)p_local,y_00 - A_00,x_00 - A,y_00 + A_00,x_00 + A,false
                           ,FEAT_GRASS,true), _Var3)) {
      lVar9 = loc(x_00,y_00);
      last_place = last_place + L'\xffffffff';
      floors = p_local->au + *(wchar_t *)&p_local->ht;
      for (plats = L'\0'; plats < L'\x14'; plats = plats + L'\x01') {
        wVar4 = distance(lVar9,pathpoints[(long)plats + -1]);
        if (wVar4 < floors) {
          stairs[2] = pathpoints[(long)plats + -1];
          floors = wVar4;
        }
      }
      mtn_connect((chunk_conflict *)p_local,lVar9,stairs[2]);
      if (last_place == L'\0') break;
    }
  }
  while (wVar4 = *(wchar_t *)((long)&p_local->class + 4),
        SBORROW4(dist,wVar4 * 0x32) != dist + wVar4 * -0x32 < 0) {
    uVar6 = Rand_div(*(wchar_t *)&p_local->ht + L'\xfffffffe');
    uVar7 = Rand_div(p_local->au + L'\xfffffffe');
    i = uVar6 + 1;
    j = uVar7 + 1;
    wVar4 = make_formation((chunk_conflict *)p_local,p,(loc)_j,FEAT_GRANITE,FEAT_GRANITE,&local_188,
                           "Mountain",*(wchar_t *)((long)&p_local->class + 4) << 1);
    dist = wVar4 + dist;
    floors = p_local->au + *(wchar_t *)&p_local->ht;
    for (plats = L'\0'; plats < L'\x14'; plats = plats + L'\x01') {
      wVar4 = distance((loc)_j,pathpoints[(long)plats + -1]);
      if (wVar4 < floors) {
        stairs[2] = pathpoints[(long)plats + -1];
        floors = wVar4;
      }
    }
    mtn_connect((chunk_conflict *)p_local,(loc)_j,stairs[2]);
  }
  wVar4 = L'\0';
  while (wVar4 < *(wchar_t *)&p_local->ht) {
    _j = (loc_conflict)((ulong)(uint)wVar4 << 0x20);
    while( true ) {
      if (p_local->au <= j) break;
      square_unmark((chunk *)p_local,_j);
      j = j + L'\x01';
    }
    wVar4 = i + L'\x01';
  }
  ensure_connectedness((chunk_conflict *)p_local,false);
  populate((chunk_conflict *)p_local,false);
  _Var3 = verify_level((chunk_conflict *)p_local);
  if (!_Var3) {
    wipe_mon_list((chunk *)p_local,p);
    cave_free((chunk_conflict *)p_local);
    *p_error = "wilderness level had generation issues";
    p_local = (player *)0x0;
  }
  return (chunk_conflict *)p_local;
}

Assistant:

struct chunk *mtn_gen(struct player *p, int height, int width,
					  const char **p_error)
{
	struct loc grid;
	int i, j;
	int plats;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int min, dist, floors = 0;
	int randpoints[20];
	struct loc pathpoints[20];
	struct loc nearest_point = { height / 2, width / 2 };
	struct loc stairs[3];

	int form_feats[] = { FEAT_PASS_RUBBLE, FEAT_RUBBLE, FEAT_GRASS,
						 FEAT_TREE, FEAT_TREE2, FEAT_ROAD, FEAT_NONE };

	bool amon_rudh = false;

	/* Make the level */
	struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass (lets paths work -NRM-) */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, false, false);

	/* Place 2 or 3 paths to neighbouring places, make the paths through the
	 * place, place the player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Turn grass to granite */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_GRASS) {
				square_set_feat(c, grid, FEAT_GRANITE);
			}
		}
	}

	/* Dungeon entrance */
	if (world->levels[place].down) {
		/* Set the flag */
		amon_rudh = true;

		/* Mim's cave on Amon Rudh */
		i = 3;
		while (i) {
			grid.y = randint0(c->height - 2) + 1;
			grid.x = randint0(c->width - 2) + 1;
			if ((square_feat(c, grid)->fidx == FEAT_ROAD) ||
				(square_feat(c, grid)->fidx == FEAT_GRASS)) {
				square_set_feat(c, grid, FEAT_MORE);
				square_mark(c, grid);
				i--;
				stairs[2 - i] = grid;
				if (!i && (level_topography(last_place) == TOP_CAVE))
					player_place(c, p, grid);
			}
		}
	}


	/* Make paths permanent */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				/* Hack - prepare for plateaux, connecting */
				square_mark(c, grid);
				floors++;
			}
		}
	}

	/* Pick some joining points */
	for (j = 0; j < 20; j++)
		randpoints[j] = randint0(floors);
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD)
				floors--;
			else
				continue;
			for (j = 0; j < 20; j++) {
				if (floors == randpoints[j]) {
					pathpoints[j] = grid;
				}
			}
		}
	}

	/* Find the staircases, if any */
	if (amon_rudh) {
		for (j = 0; j < 3; j++) {
			grid = stairs[j];

			/* Now join them up */
			min = c->width + c->height;
			for (i = 0; i < 20; i++) {
				dist = distance(grid, pathpoints[i]);
				if (dist < min) {
					min = dist;
					nearest_point = pathpoints[i];
				}
			}
			mtn_connect(c, grid, nearest_point);
		}
	}

	/* Make a few "plateaux" */
	plats = rand_range(2, 4);

	/* Try fairly hard */
	for (j = 0; j < 50; j++) {
		int a, b, x, y;

		/* Try for a plateau */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		y = rand_range(b, c->height - 1 - b);
		x = rand_range(a, c->width - 1 - a);
		if (!check_clearing_space(c, loc_sum(loc(x, y), loc(-a, -b)),
				loc_sum(loc(x, y), loc(a, b)))
				|| !generate_starburst_room(c, y - b, x - a,
				y + b, x + a, false, FEAT_GRASS, true)) continue;

		/* Success */
		grid = loc(x, y);
		plats--;

		/* Now join it up */
		min = c->width + c->height;
		for (i = 0; i < 20; i++) {
			dist = distance(grid, pathpoints[i]);
			if (dist < min) {
				min = dist;
				nearest_point = pathpoints[i];
			}
		}
		mtn_connect(c, grid, nearest_point);

		/* Done ? */
		if (!plats)
			break;
	}

	/* Make a few formations */
	while (form_grids < 50 * (c->depth)) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_GRANITE, FEAT_GRANITE,
									 form_feats, "Mountain", c->depth * 2);
		/* Now join it up */
		min = c->width + c->height;
		for (i = 0; i < 20; i++) {
			dist = distance(grid, pathpoints[i]);
			if (dist < min) {
				min = dist;
				nearest_point = pathpoints[i];
			}
		}
		mtn_connect(c, grid, nearest_point);

	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}
	ensure_connectedness(c, false);

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}